

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NGramStorageTest.cpp
# Opt level: O3

uint32_t get_continuations_count
                   (vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                    *ngrams,vector<unsigned_int,_std::allocator<unsigned_int>_> *ngram)

{
  pointer ppVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  bool bVar5;
  uint32_t uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  ppVar1 = (ngrams->
           super__Vector_base<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(ngrams->
                super__Vector_base<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar7 == 0) {
    return 0;
  }
  puVar2 = (ngram->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (ngram->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = (long)puVar3 - (long)puVar2;
  uVar9 = 0;
  uVar6 = 0;
  do {
    lVar4 = *(long *)&ppVar1[uVar9].first.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
    if (uVar8 < (ulong)((long)*(pointer *)
                               ((long)&ppVar1[uVar9].first.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl + 8) - lVar4)) {
      if (puVar3 != puVar2) {
        bVar5 = true;
        uVar10 = 0;
        do {
          bVar5 = (bool)(bVar5 & *(uint *)(lVar4 + uVar10 * 4) == puVar2[uVar10]);
          uVar10 = uVar10 + 1;
        } while ((uVar10 & 0xffffffff) < (ulong)((long)uVar8 >> 2));
        if (!bVar5) goto LAB_00108721;
      }
      uVar6 = uVar6 + ppVar1[uVar9].second;
    }
LAB_00108721:
    uVar9 = uVar9 + 1;
    if ((ulong)(lVar7 >> 5) <= (uVar9 & 0xffffffff)) {
      return uVar6;
    }
  } while( true );
}

Assistant:

uint32_t get_continuations_count(vector<pair<vector<uint32_t>, uint32_t>>& ngrams,
                                 vector<uint32_t> ngram) {
    uint32_t res = 0;
    for (uint32_t i = 0; i < ngrams.size(); i++) {
        if (ngrams[i].first.size() > ngram.size()) {
            bool same = true;
            for (uint32_t j = 0; j < ngram.size(); j++)
                same &= ngrams[i].first[j] == ngram[j];
            if (same)
                res += ngrams[i].second;
        }
    }

    return res;
}